

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall
mkvparser::Cluster::ParseBlockGroup(Cluster *this,longlong payload_size,longlong *pos,long *len)

{
  int iVar1;
  Cluster *this_00;
  IMkvReader *pReader_00;
  long lVar2;
  long *in_RCX;
  long *in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  int lacing;
  uchar flags;
  longlong track;
  longlong block_stop;
  longlong unknown_size;
  longlong size;
  longlong id;
  longlong result;
  longlong discard_padding;
  long status;
  longlong avail;
  longlong total;
  IMkvReader *pReader;
  longlong payload_stop;
  longlong payload_start;
  int in_stack_ffffffffffffff68;
  uint in_stack_ffffffffffffff6c;
  longlong in_stack_ffffffffffffff70;
  IMkvReader *in_stack_ffffffffffffff78;
  IMkvReader *in_stack_ffffffffffffff80;
  IMkvReader *in_stack_ffffffffffffff88;
  longlong in_stack_ffffffffffffff90;
  IMkvReader *in_stack_ffffffffffffff98;
  longlong id_00;
  long local_50;
  long local_48;
  long *local_40;
  long local_38;
  long local_30;
  long *local_28;
  long *local_20;
  long local_18;
  Cluster *local_8;
  
  local_30 = *in_RDX;
  local_38 = *in_RDX + in_RSI;
  local_40 = *(long **)*in_RDI;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  iVar1 = (**(code **)(*local_40 + 8))(local_40,&local_48,&local_50);
  this_00 = (Cluster *)(long)iVar1;
  local_8 = this_00;
  if (-1 < (long)this_00) {
    if ((local_48 < 0) || (local_38 <= local_48)) {
      if (local_50 < local_38) {
        *local_28 = local_18;
        local_8 = (Cluster *)0xfffffffffffffffd;
      }
      else {
        id_00 = 0;
        do {
          while( true ) {
            do {
              if (local_38 <= *local_20) {
                if (*local_20 != local_38) {
                  return -2;
                }
                lVar2 = CreateBlock(this_00,id_00,(longlong)in_stack_ffffffffffffff98,
                                    in_stack_ffffffffffffff90,(longlong)in_stack_ffffffffffffff88);
                if (lVar2 != 0) {
                  return lVar2;
                }
                in_RDI[3] = local_38;
                return 0;
              }
              if (local_50 < *local_20 + 1) {
                *local_28 = 1;
                return -3;
              }
              pReader_00 = (IMkvReader *)
                           GetUIntLength(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                                         (long *)CONCAT44(in_stack_ffffffffffffff6c,
                                                          in_stack_ffffffffffffff68));
              if ((long)pReader_00 < 0) {
                return (long)pReader_00;
              }
              if (0 < (long)pReader_00) {
                return -3;
              }
              if (local_38 < *local_20 + *local_28) {
                return -2;
              }
              if (local_50 < *local_20 + *local_28) {
                return -3;
              }
              in_stack_ffffffffffffff90 =
                   ReadID(pReader_00,in_stack_ffffffffffffff90,(long *)in_stack_ffffffffffffff88);
              if (in_stack_ffffffffffffff90 < 0) {
                return in_stack_ffffffffffffff90;
              }
              if (in_stack_ffffffffffffff90 == 0) {
                return -2;
              }
              *local_20 = *local_28 + *local_20;
              if (local_50 < *local_20 + 1) {
                *local_28 = 1;
                return -3;
              }
              in_stack_ffffffffffffff98 =
                   (IMkvReader *)
                   GetUIntLength(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                                 (long *)CONCAT44(in_stack_ffffffffffffff6c,
                                                  in_stack_ffffffffffffff68));
              if ((long)in_stack_ffffffffffffff98 < 0) {
                return (long)in_stack_ffffffffffffff98;
              }
              if (0 < (long)in_stack_ffffffffffffff98) {
                return -3;
              }
              if (local_38 < *local_20 + *local_28) {
                return -2;
              }
              if (local_50 < *local_20 + *local_28) {
                return -3;
              }
              in_stack_ffffffffffffff88 =
                   (IMkvReader *)
                   ReadUInt(in_stack_ffffffffffffff88,(longlong)in_stack_ffffffffffffff80,
                            (long *)in_stack_ffffffffffffff78);
              if ((long)in_stack_ffffffffffffff88 < 0) {
                return (long)in_stack_ffffffffffffff88;
              }
              *local_20 = *local_28 + *local_20;
              if (local_38 < *local_20) {
                return -2;
              }
            } while (in_stack_ffffffffffffff88 == (IMkvReader *)0x0);
            in_stack_ffffffffffffff80 =
                 (IMkvReader *)((1L << ((char)*local_28 * '\a' & 0x3fU)) + -1);
            if (in_stack_ffffffffffffff88 == in_stack_ffffffffffffff80) {
              return -2;
            }
            if ((in_stack_ffffffffffffff90 == 0x75a2) &&
               (this_00 = (Cluster *)
                          UnserializeInt(in_stack_ffffffffffffff98,0x75a2,
                                         (longlong)in_stack_ffffffffffffff88,
                                         (longlong *)in_stack_ffffffffffffff80), (long)this_00 < 0))
            {
              return (long)this_00;
            }
            if (in_stack_ffffffffffffff90 == 0xa1) break;
            *local_20 = (long)&in_stack_ffffffffffffff88->_vptr_IMkvReader + *local_20;
            if (local_38 < *local_20) {
              return -2;
            }
          }
          in_stack_ffffffffffffff78 =
               (IMkvReader *)((long)&in_stack_ffffffffffffff88->_vptr_IMkvReader + *local_20);
          if (local_38 < (long)in_stack_ffffffffffffff78) {
            return -2;
          }
          if (local_50 < *local_20 + 1) {
            *local_28 = 1;
            return -3;
          }
          in_stack_ffffffffffffff98 =
               (IMkvReader *)
               GetUIntLength(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                             (long *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
          if ((long)in_stack_ffffffffffffff98 < 0) {
            return (long)in_stack_ffffffffffffff98;
          }
          if (0 < (long)in_stack_ffffffffffffff98) {
            return -3;
          }
          if ((long)in_stack_ffffffffffffff78 < *local_20 + *local_28) {
            return -2;
          }
          if (local_50 < *local_20 + *local_28) {
            return -3;
          }
          in_stack_ffffffffffffff70 =
               ReadUInt(in_stack_ffffffffffffff88,(longlong)in_stack_ffffffffffffff80,
                        (long *)in_stack_ffffffffffffff78);
          if (in_stack_ffffffffffffff70 < 0) {
            return in_stack_ffffffffffffff70;
          }
          if (in_stack_ffffffffffffff70 == 0) {
            return -2;
          }
          *local_20 = *local_28 + *local_20;
          if ((long)in_stack_ffffffffffffff78 < *local_20 + 2) {
            return -2;
          }
          if (local_50 < *local_20 + 2) {
            *local_28 = 2;
            return -3;
          }
          *local_20 = *local_20 + 2;
          if ((long)in_stack_ffffffffffffff78 < *local_20 + 1) {
            return -2;
          }
          if (local_50 < *local_20 + 1) {
            *local_28 = 1;
            return -3;
          }
          iVar1 = (**(code **)*local_40)(local_40,*local_20,1,&stack0xffffffffffffff6f);
          this_00 = (Cluster *)(long)iVar1;
          if ((long)this_00 < 0) {
            *local_28 = 1;
            return (long)this_00;
          }
          *local_20 = *local_20 + 1;
          if ((long)in_stack_ffffffffffffff78 <= *local_20) {
            return -2;
          }
          in_stack_ffffffffffffff68 = (int)(in_stack_ffffffffffffff6c >> 0x18 & 6) >> 1;
          if ((in_stack_ffffffffffffff68 != 0) && (local_50 < (long)in_stack_ffffffffffffff78)) {
            *local_28 = (long)in_stack_ffffffffffffff78 - *local_20;
            return -3;
          }
          *local_20 = (long)in_stack_ffffffffffffff78;
        } while (*local_20 <= local_38);
        local_8 = (Cluster *)0xfffffffffffffffe;
      }
    }
    else {
      local_8 = (Cluster *)0xfffffffffffffffe;
    }
  }
  return (long)local_8;
}

Assistant:

long Cluster::ParseBlockGroup(long long payload_size, long long& pos,
                              long& len) {
  const long long payload_start = pos;
  const long long payload_stop = pos + payload_size;

  IMkvReader* const pReader = m_pSegment->m_pReader;

  long long total, avail;

  long status = pReader->Length(&total, &avail);

  if (status < 0)  // error
    return status;

  assert((total < 0) || (avail <= total));

  if ((total >= 0) && (payload_stop > total))
    return E_FILE_FORMAT_INVALID;

  if (payload_stop > avail) {
    len = static_cast<long>(payload_size);
    return E_BUFFER_NOT_FULL;
  }

  long long discard_padding = 0;

  while (pos < payload_stop) {
    // parse sub-block element ID

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    long long result = GetUIntLength(pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)  // weird
      return E_BUFFER_NOT_FULL;

    if ((pos + len) > payload_stop)
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long id = ReadID(pReader, pos, len);

    if (id < 0)  // error
      return static_cast<long>(id);

    if (id == 0)  // not a valid ID
      return E_FILE_FORMAT_INVALID;

    pos += len;  // consume ID field

    // Parse Size

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    result = GetUIntLength(pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)  // weird
      return E_BUFFER_NOT_FULL;

    if ((pos + len) > payload_stop)
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long size = ReadUInt(pReader, pos, len);

    if (size < 0)  // error
      return static_cast<long>(size);

    pos += len;  // consume size field

    // pos now points to start of sub-block group payload

    if (pos > payload_stop)
      return E_FILE_FORMAT_INVALID;

    if (size == 0)  // weird
      continue;

    const long long unknown_size = (1LL << (7 * len)) - 1;

    if (size == unknown_size)
      return E_FILE_FORMAT_INVALID;

    if (id == libwebm::kMkvDiscardPadding) {
      status = UnserializeInt(pReader, pos, size, discard_padding);

      if (status < 0)  // error
        return status;
    }

    if (id != libwebm::kMkvBlock) {
      pos += size;  // consume sub-part of block group

      if (pos > payload_stop)
        return E_FILE_FORMAT_INVALID;

      continue;
    }

    const long long block_stop = pos + size;

    if (block_stop > payload_stop)
      return E_FILE_FORMAT_INVALID;

    // parse track number

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    result = GetUIntLength(pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)  // weird
      return E_BUFFER_NOT_FULL;

    if ((pos + len) > block_stop)
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long track = ReadUInt(pReader, pos, len);

    if (track < 0)  // error
      return static_cast<long>(track);

    if (track == 0)
      return E_FILE_FORMAT_INVALID;

    pos += len;  // consume track number

    if ((pos + 2) > block_stop)
      return E_FILE_FORMAT_INVALID;

    if ((pos + 2) > avail) {
      len = 2;
      return E_BUFFER_NOT_FULL;
    }

    pos += 2;  // consume timecode

    if ((pos + 1) > block_stop)
      return E_FILE_FORMAT_INVALID;

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    unsigned char flags;

    status = pReader->Read(pos, 1, &flags);

    if (status < 0) {  // error or underflow
      len = 1;
      return status;
    }

    ++pos;  // consume flags byte
    assert(pos <= avail);

    if (pos >= block_stop)
      return E_FILE_FORMAT_INVALID;

    const int lacing = int(flags & 0x06) >> 1;

    if ((lacing != 0) && (block_stop > avail)) {
      len = static_cast<long>(block_stop - pos);
      return E_BUFFER_NOT_FULL;
    }

    pos = block_stop;  // consume block-part of block group
    if (pos > payload_stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != payload_stop)
    return E_FILE_FORMAT_INVALID;

  status = CreateBlock(libwebm::kMkvBlockGroup, payload_start, payload_size,
                       discard_padding);
  if (status != 0)
    return status;

  m_pos = payload_stop;

  return 0;  // success
}